

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

char __thiscall AggressiveBotStrategy::yesOrNo(AggressiveBotStrategy *this,StrategyContext context)

{
  bool bVar1;
  ostream *this_00;
  char local_2b;
  char local_29;
  char local_15;
  char botChoice;
  StrategyContext context_local;
  AggressiveBotStrategy *this_local;
  
  if (context == ATTACK) {
    bVar1 = canAttack(this);
    local_29 = 'y';
    if (!bVar1) {
      local_29 = 'n';
    }
    local_15 = local_29;
  }
  else if (context == FORTIFY) {
    bVar1 = canFortify(this);
    local_2b = 'y';
    if (!bVar1) {
      local_2b = 'n';
    }
    local_15 = local_2b;
  }
  else if (context == REINFORCE) {
    local_15 = 'y';
  }
  else {
    local_15 = 'n';
  }
  this_00 = std::operator<<((ostream *)&std::cout,local_15);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return local_15;
}

Assistant:

signed char AggressiveBotStrategy::yesOrNo(StrategyContext context) {
    char botChoice = 0;
    switch ((int) context) {
        case StrategyContext::ATTACK:
            botChoice = canAttack() ? 'y' : 'n';
            break;
        case StrategyContext::FORTIFY:
            botChoice = canFortify() ? 'y' : 'n';
            break;
        case StrategyContext::REINFORCE:
            botChoice = 'y';
            break;
        default: {
            // Should never occur
            botChoice = 'n';
        }
    }
    std::cout << botChoice << std::endl;
    return botChoice;
}